

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O1

bool __thiscall
QTableModel::removeColumns(QTableModel *this,int column,int count,QModelIndex *param_3)

{
  QList<QTableWidgetItem_*> *pQVar1;
  ulong uVar2;
  QTableWidgetItem *pQVar3;
  Data *pDVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long in_FS_OFFSET;
  int local_70;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (-1 < column && 0 < count) {
    if ((ulong)(uint)(column + count) <= (ulong)(this->horizontalHeaderItems).d.size) {
      local_50 = 0xffffffffffffffff;
      local_48 = 0;
      uStack_40 = 0;
      QAbstractItemModel::beginRemoveColumns((QModelIndex *)this,(int)&local_50,column);
      local_50 = 0xffffffffffffffff;
      local_48 = 0;
      uStack_40 = 0;
      uVar6 = (**(code **)(*(long *)this + 0x78))(this);
      uVar7 = (ulong)(uint)column;
      if (0 < (int)uVar6) {
        pQVar1 = &this->tableItems;
        uVar9 = (ulong)uVar6;
        do {
          uVar2 = uVar9 - 1;
          lVar8 = (this->horizontalHeaderItems).d.size;
          lVar10 = lVar8 * uVar2 + uVar7;
          if (0 < count) {
            local_70 = (int)uVar2;
            lVar8 = (long)((int)lVar8 * local_70 + column);
            do {
              pQVar3 = (this->tableItems).d.ptr[lVar8];
              if (pQVar3 != (QTableWidgetItem *)0x0) {
                pQVar3->view = (QTableWidget *)0x0;
                (*pQVar3->_vptr_QTableWidgetItem[1])();
              }
              lVar8 = lVar8 + 1;
            } while (lVar8 < (int)lVar10 + count);
          }
          if (count != 0) {
            pDVar4 = (pQVar1->d).d;
            if ((pDVar4 == (Data *)0x0) ||
               (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
              QArrayDataPointer<QTableWidgetItem_*>::reallocateAndGrow
                        (&pQVar1->d,GrowsAtEnd,0,(QArrayDataPointer<QTableWidgetItem_*> *)0x0);
            }
            QtPrivate::QPodArrayOps<QTableWidgetItem_*>::erase
                      ((QPodArrayOps<QTableWidgetItem_*> *)pQVar1,
                       (QTableWidgetItem **)
                       (((lVar10 << 0x20) >> 0x1d) + (long)(this->tableItems).d.ptr),
                       (ulong)(uint)count);
          }
          bVar5 = 1 < (long)uVar9;
          uVar9 = uVar2;
        } while (bVar5);
      }
      uVar9 = uVar7;
      if (0 < count) {
        do {
          pQVar3 = (this->horizontalHeaderItems).d.ptr[uVar9];
          if (pQVar3 != (QTableWidgetItem *)0x0) {
            pQVar3->view = (QTableWidget *)0x0;
            (*pQVar3->_vptr_QTableWidgetItem[1])();
          }
          uVar9 = uVar9 + 1;
        } while ((int)uVar9 < column + count);
      }
      if (count != 0) {
        pQVar1 = &this->horizontalHeaderItems;
        pDVar4 = (pQVar1->d).d;
        if ((pDVar4 == (Data *)0x0) ||
           (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
          QArrayDataPointer<QTableWidgetItem_*>::reallocateAndGrow
                    (&pQVar1->d,GrowsAtEnd,0,(QArrayDataPointer<QTableWidgetItem_*> *)0x0);
        }
        QtPrivate::QPodArrayOps<QTableWidgetItem_*>::erase
                  ((QPodArrayOps<QTableWidgetItem_*> *)pQVar1,
                   (this->horizontalHeaderItems).d.ptr + uVar7,(ulong)(uint)count);
      }
      QAbstractItemModel::endRemoveColumns();
      bVar5 = true;
      goto LAB_0059cf7a;
    }
  }
  bVar5 = false;
LAB_0059cf7a:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar5;
}

Assistant:

bool QTableModel::removeColumns(int column, int count, const QModelIndex &)
{
    if (count < 1 || column < 0 || column + count >  horizontalHeaderItems.size())
        return false;

    beginRemoveColumns(QModelIndex(), column, column + count - 1);
    QTableWidgetItem *oldItem = nullptr;
    for (int row = rowCount() - 1; row >= 0; --row) {
        int i = tableIndex(row, column);
        for (int j = i; j < i + count; ++j) {
            oldItem = tableItems.at(j);
            if (oldItem)
                oldItem->view = nullptr;
            delete oldItem;
        }
        tableItems.remove(i, count);
    }
    for (int h=column; h<column+count; ++h) {
        oldItem = horizontalHeaderItems.at(h);
        if (oldItem)
            oldItem->view = nullptr;
        delete oldItem;
    }
    horizontalHeaderItems.remove(column, count);
    endRemoveColumns();
    return true;
}